

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

bool __thiscall pbrt::Triangle::IntersectP(Triangle *this,Ray *ray,Float tMax)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  Point3f p0;
  Point3f p1;
  Point3f p2;
  optional<pbrt::TriangleIntersection> isect;
  optional<pbrt::TriangleIntersection> local_1c;
  
  *(long *)(in_FS_OFFSET + -0x408) = *(long *)(in_FS_OFFSET + -0x408) + 1;
  lVar3 = (long)this->triIndex;
  lVar1 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar2 = *(long *)(lVar1 + 8);
  lVar1 = *(long *)(lVar1 + 0x10);
  lVar4 = (long)*(int *)(lVar2 + lVar3 * 0xc);
  lVar5 = (long)*(int *)(lVar2 + 4 + lVar3 * 0xc);
  lVar2 = (long)*(int *)(lVar2 + 8 + lVar3 * 0xc);
  p0.super_Tuple3<pbrt::Point3,_float>.z = *(float *)(lVar1 + 8 + lVar4 * 0xc);
  p0.super_Tuple3<pbrt::Point3,_float>._0_8_ = *(undefined8 *)(lVar1 + lVar4 * 0xc);
  p1.super_Tuple3<pbrt::Point3,_float>.z = *(float *)(lVar1 + 8 + lVar5 * 0xc);
  p1.super_Tuple3<pbrt::Point3,_float>._0_8_ = *(undefined8 *)(lVar1 + lVar5 * 0xc);
  p2.super_Tuple3<pbrt::Point3,_float>.z = *(float *)(lVar1 + 8 + lVar2 * 0xc);
  p2.super_Tuple3<pbrt::Point3,_float>._0_8_ = *(undefined8 *)(lVar1 + lVar2 * 0xc);
  IntersectTriangle(&local_1c,ray,tMax,p0,p1,p2);
  if (local_1c.set == true) {
    *(long *)(in_FS_OFFSET + -0x400) = *(long *)(in_FS_OFFSET + -0x400) + 1;
  }
  return local_1c.set;
}

Assistant:

bool Triangle::IntersectP(const Ray &ray, Float tMax) const {
#ifndef PBRT_IS_GPU_CODE
    ++nTriTests;
#endif
    // Get triangle vertices in _p0_, _p1_, and _p2_
    const TriangleMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[3 * triIndex];
    Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

    pstd::optional<TriangleIntersection> isect = IntersectTriangle(ray, tMax, p0, p1, p2);
    if (isect) {
#ifndef PBRT_IS_GPU_CODE
        ++nTriHits;
#endif
        return true;
    } else
        return false;
}